

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O0

Map<asl::String,_int> * __thiscall
asl::Map<asl::String,_int>::set(Map<asl::String,_int> *this,String *key,int *value)

{
  int iVar1;
  uint k;
  KeyVal *pKVar2;
  KeyVal local_50;
  uint local_2c;
  int *piStack_28;
  int i;
  int *value_local;
  String *key_local;
  Map<asl::String,_int> *this_local;
  
  piStack_28 = value;
  value_local = &key->_size;
  key_local = (String *)this;
  local_2c = indexOf(this,key);
  if ((int)local_2c < 0) {
    k = ~local_2c;
    KeyVal::KeyVal(&local_50,(String *)value_local,piStack_28);
    Array<asl::Map<asl::String,_int>::KeyVal>::insert(&this->a,k,&local_50);
    KeyVal::~KeyVal(&local_50);
  }
  else {
    iVar1 = *piStack_28;
    pKVar2 = Array<asl::Map<asl::String,_int>::KeyVal>::operator[](&this->a,local_2c);
    pKVar2->value = iVar1;
  }
  return this;
}

Assistant:

Map& set(const K& key, const T& value)
	{
		int i=indexOf(key);
		if(i >= 0)
		{
			a[i].value = value;
			return *this;
		}
		a.insert(-i-1, KeyVal(key, value));
		return *this;
	}